

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O1

void __thiscall AWeapon::AttachToOwner(AWeapon *this,AActor *other)

{
  player_t *ppVar1;
  APlayerPawn *pAVar2;
  undefined8 *puVar3;
  AAmmo *pAVar4;
  AWeapon *pAVar5;
  undefined8 *puVar6;
  APlayerPawn *pAVar7;
  AActor *pAVar8;
  
  AInventory::AttachToOwner(&this->super_AInventory,other);
  pAVar8 = (this->super_AInventory).Owner.field_0.p;
  if ((pAVar8 != (AActor *)0x0) &&
     (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (this->super_AInventory).Owner.field_0.p = (AActor *)0x0;
    pAVar8 = (AActor *)0x0;
  }
  pAVar4 = AddAmmo(this,pAVar8,(PClassActor *)this->AmmoType1,this->AmmoGive1);
  (this->Ammo1).field_0.p = pAVar4;
  pAVar8 = (this->super_AInventory).Owner.field_0.p;
  if ((pAVar8 != (AActor *)0x0) &&
     (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (this->super_AInventory).Owner.field_0.p = (AActor *)0x0;
    pAVar8 = (AActor *)0x0;
  }
  pAVar4 = AddAmmo(this,pAVar8,(PClassActor *)this->AmmoType2,this->AmmoGive2);
  (this->Ammo2).field_0.p = pAVar4;
  pAVar5 = AddWeapon(this,this->SisterWeaponType);
  (this->SisterWeapon).field_0.p = pAVar5;
  if (((this->super_AInventory).Owner.field_0.p)->player != (player_t *)0x0) {
    ppVar1 = ((this->super_AInventory).Owner.field_0.p)->player;
    puVar3 = (undefined8 *)
             ((long)&((ppVar1->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                     .Nodes)->Next +
             (ulong)(((ppVar1->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                      .Size - 1 & 0x21a) * 0x18));
    do {
      puVar6 = puVar3;
      puVar3 = (undefined8 *)*puVar6;
    } while (*(int *)(puVar6 + 1) != 0x21a);
    if ((*(char *)(puVar6[2] + 0x28) == '\0') &&
       (((this->super_AInventory).field_0x4dd & 0x10) == 0)) {
      ((this->super_AInventory).Owner.field_0.p)->player->PendingWeapon = this;
    }
    pAVar2 = ((this->super_AInventory).Owner.field_0.p)->player->mo;
    pAVar7 = (APlayerPawn *)(&DAT_00a39408)[(long)consoleplayer * 0x54];
    if ((pAVar7 != (APlayerPawn *)0x0) &&
       (((pAVar7->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
      (&DAT_00a39408)[(long)consoleplayer * 0x54] = 0;
      pAVar7 = (APlayerPawn *)0x0;
    }
    if (pAVar2 == pAVar7) {
      (*(StatusBar->super_DObject)._vptr_DObject[0x12])(StatusBar,this);
    }
  }
  this->GivenAsMorphWeapon = false;
  return;
}

Assistant:

void AWeapon::AttachToOwner (AActor *other)
{
	Super::AttachToOwner (other);

	Ammo1 = AddAmmo (Owner, AmmoType1, AmmoGive1);
	Ammo2 = AddAmmo (Owner, AmmoType2, AmmoGive2);
	SisterWeapon = AddWeapon (SisterWeaponType);
	if (Owner->player != NULL)
	{
		if (!Owner->player->userinfo.GetNeverSwitch() && !(WeaponFlags & WIF_NO_AUTO_SWITCH))
		{
			Owner->player->PendingWeapon = this;
		}
		if (Owner->player->mo == players[consoleplayer].camera)
		{
			StatusBar->ReceivedWeapon (this);
		}
	}
	GivenAsMorphWeapon = false; // will be set explicitly by morphing code
}